

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.h
# Opt level: O1

int get_current_frame_ref_type(AV1_COMP *cpi)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)(cpi->ppi->gf_group).layer_depth[cpi->gf_frame_index];
  iVar1 = 7;
  if (uVar2 < 8) {
    iVar1 = *(int *)(&DAT_00ddc95c + uVar2 * 4);
  }
  return iVar1;
}

Assistant:

static inline int get_current_frame_ref_type(const AV1_COMP *const cpi) {
  // We choose the reference "type" of this frame from the flags which indicate
  // which reference frames will be refreshed by it. More than one of these
  // flags may be set, so the order here implies an order of precedence. This is
  // just used to choose the primary_ref_frame (as the most recent reference
  // buffer of the same reference-type as the current frame).

  switch (cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index]) {
    case 0: return 0;
    case 1: return 1;
    case MAX_ARF_LAYERS:
    case MAX_ARF_LAYERS + 1: return 4;
    default: return 7;
  }
}